

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O3

vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
* __thiscall
xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::GetAllEdges
          (vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
           *__return_storage_ptr__,Graph<SimpleState_*,_double,_SimpleStateIndexer> *this)

{
  pointer *pp_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  iterator __position;
  _List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var2 = (this->vertex_map_)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    p_Var3 = p_Var2[2]._M_nxt;
    for (local_28._M_node = (_List_node_base *)p_Var3[3]._M_nxt;
        local_28._M_node != (_List_node_base *)(p_Var3 + 3);
        local_28._M_node = (local_28._M_node)->_M_next) {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::_List_iterator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::Edge>,std::allocator<std::_List_iterator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::Edge>>>
        ::
        _M_realloc_insert<std::_List_iterator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::Edge>const&>
                  ((vector<std::_List_iterator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::Edge>,std::allocator<std::_List_iterator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::Edge>>>
                    *)__return_storage_ptr__,__position,&local_28);
      }
      else {
        (__position._M_current)->_M_node = local_28._M_node;
        pp_Var1 = &(__return_storage_ptr__->
                   super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename Graph<State, Transition, StateIndexer>::edge_iterator>
Graph<State, Transition, StateIndexer>::GetAllEdges() const {
  std::vector<typename Graph<State, Transition, StateIndexer>::edge_iterator>
      edges;
  for (auto &vertex_pair : vertex_map_) {
    auto vertex = vertex_pair.second;
    for (auto it = vertex->edge_begin(); it != vertex->edge_end(); ++it)
      edges.push_back(it);
  }
  return edges;
}